

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_constraints.cc
# Opt level: O0

bool bssl::anon_unknown_0::ParseGeneralSubtrees
               (Input value,GeneralNames *subtrees,CertErrors *errors)

{
  bool bVar1;
  CertErrors *in_R9;
  Input input;
  undefined1 local_80 [8];
  Input raw_general_name;
  Parser subtree_sequence;
  undefined1 local_48 [8];
  Parser sequence_parser;
  CertErrors *errors_local;
  GeneralNames *subtrees_local;
  Input value_local;
  
  sequence_parser.advance_len_ = (size_t)errors;
  if (errors == (CertErrors *)0x0) {
    abort();
  }
  bssl::der::Parser::Parser((Parser *)local_48,value);
  bVar1 = bssl::der::Parser::HasMore((Parser *)local_48);
  if (bVar1) {
    do {
      bVar1 = bssl::der::Parser::HasMore((Parser *)local_48);
      if (!bVar1) {
        return true;
      }
      bssl::der::Parser::Parser((Parser *)&raw_general_name.data_.size_);
      bVar1 = bssl::der::Parser::ReadSequence
                        ((Parser *)local_48,(Parser *)&raw_general_name.data_.size_);
      if (!bVar1) {
        return false;
      }
      bssl::der::Input::Input((Input *)local_80);
      bVar1 = bssl::der::Parser::ReadRawTLV
                        ((Parser *)&raw_general_name.data_.size_,(Input *)local_80);
      if (!bVar1) {
        return false;
      }
      input.data_.size_ = 1;
      input.data_.data_ = raw_general_name.data_.data_;
      bVar1 = ParseGeneralName((bssl *)local_80,input,(ParseGeneralNameIPAddressType)subtrees,
                               (GeneralNames *)sequence_parser.advance_len_,in_R9);
      if (!bVar1) {
        CertErrors::AddError
                  ((CertErrors *)sequence_parser.advance_len_,"Failed parsing GeneralName");
        return false;
      }
      bVar1 = bssl::der::Parser::HasMore((Parser *)&raw_general_name.data_.size_);
    } while (!bVar1);
  }
  return false;
}

Assistant:

[[nodiscard]] bool ParseGeneralSubtrees(der::Input value,
                                        GeneralNames *subtrees,
                                        CertErrors *errors) {
  BSSL_CHECK(errors);

  // GeneralSubtrees ::= SEQUENCE SIZE (1..MAX) OF GeneralSubtree
  //
  // GeneralSubtree ::= SEQUENCE {
  //      base                    GeneralName,
  //      minimum         [0]     BaseDistance DEFAULT 0,
  //      maximum         [1]     BaseDistance OPTIONAL }
  //
  // BaseDistance ::= INTEGER (0..MAX)
  der::Parser sequence_parser(value);
  // The GeneralSubtrees sequence should have at least 1 element.
  if (!sequence_parser.HasMore()) {
    return false;
  }
  while (sequence_parser.HasMore()) {
    der::Parser subtree_sequence;
    if (!sequence_parser.ReadSequence(&subtree_sequence)) {
      return false;
    }

    der::Input raw_general_name;
    if (!subtree_sequence.ReadRawTLV(&raw_general_name)) {
      return false;
    }

    if (!ParseGeneralName(raw_general_name,
                          GeneralNames::IP_ADDRESS_AND_NETMASK, subtrees,
                          errors)) {
      errors->AddError(kFailedParsingGeneralName);
      return false;
    }

    // RFC 5280 section 4.2.1.10:
    // Within this profile, the minimum and maximum fields are not used with any
    // name forms, thus, the minimum MUST be zero, and maximum MUST be absent.
    // However, if an application encounters a critical name constraints
    // extension that specifies other values for minimum or maximum for a name
    // form that appears in a subsequent certificate, the application MUST
    // either process these fields or reject the certificate.

    // Note that technically failing here isn't required: rather only need to
    // fail if a name of this type actually appears in a subsequent cert and
    // this extension was marked critical. However the minimum and maximum
    // fields appear uncommon enough that implementing that isn't useful.
    if (subtree_sequence.HasMore()) {
      return false;
    }
  }
  return true;
}